

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qpromise_p.h
# Opt level: O0

function<void_(const_QtPromisePrivate::PromiseError_&)> * __thiscall
QtPromisePrivate::PromiseCatcher<int,tst_requirements::thenMultipleCalls()::$_5,int>::
create<QtPromise::QPromiseResolve<int>,QtPromise::QPromiseReject<int>>
          (function<void_(const_QtPromisePrivate::PromiseError_&)> *__return_storage_ptr__,
          PromiseCatcher<int,tst_requirements::thenMultipleCalls()::__5,int> *this,
          anon_class_8_1_70098e60 *handler,QPromiseResolve<int> *resolve,QPromiseReject<int> *reject
          )

{
  anon_class_24_3_a63a5800 local_40;
  QPromiseReject<int> *local_28;
  QPromiseReject<int> *reject_local;
  QPromiseResolve<int> *resolve_local;
  anon_class_8_1_70098e60 *handler_local;
  
  local_28 = (QPromiseReject<int> *)resolve;
  reject_local = (QPromiseReject<int> *)handler;
  resolve_local = (QPromiseResolve<int> *)this;
  handler_local = (anon_class_8_1_70098e60 *)__return_storage_ptr__;
  QtPromise::QPromiseResolve<int>::QPromiseResolve
            (&local_40.resolve,(QPromiseResolve<int> *)handler);
  QtPromise::QPromiseReject<int>::QPromiseReject(&local_40.reject,local_28);
  local_40.handler.values = (QVector<int> *)(resolve_local->m_resolver).m_d.d;
  std::function<void(QtPromisePrivate::PromiseError_const&)>::
  function<QtPromisePrivate::PromiseCatcher<int,tst_requirements::thenMultipleCalls()::__5,int>::create<QtPromise::QPromiseResolve<int>,QtPromise::QPromiseReject<int>>(tst_requirements::thenMultipleCalls()::__5_const&,QtPromise::QPromiseResolve<int>const&,QtPromise::QPromiseReject<int>const&)::_lambda(QtPromisePrivate::PromiseError_const&)_1_,void>
            ((function<void(QtPromisePrivate::PromiseError_const&)> *)__return_storage_ptr__,
             &local_40);
  create<QtPromise::QPromiseResolve<int>,QtPromise::QPromiseReject<int>>(tst_requirements::thenMultipleCalls()::$_5_const&,QtPromise::QPromiseResolve<int>const&,QtPromise::QPromiseReject<int>const&)
  ::{lambda(QtPromisePrivate::PromiseError_const&)#1}::~function
            ((_lambda_QtPromisePrivate__PromiseError_const___1_ *)&local_40);
  return __return_storage_ptr__;
}

Assistant:

static std::function<void(const PromiseError&)>
    create(const THandler& handler, const TResolve& resolve, const TReject& reject)
    {
        return [=](const PromiseError& error) {
            try {
                error.rethrow();
            } catch (const TArg& argError) {
                PromiseDispatch<ResType>::call(resolve, reject, handler, argError);
            } catch (...) {
                reject(std::current_exception());
            }
        };
    }